

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandPrintBuf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_38;
  int fVerbose;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      pAVar2 = Abc_FrameReadNtk(pAbc);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Err,"There is no current network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pAVar2 = Abc_FrameReadNtk(pAbc);
        iVar1 = Abc_NtkHasMapping(pAVar2);
        if (iVar1 == 0) {
          fprintf((FILE *)pAbc->Err,"The current network is not mapped.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          pAVar2 = Abc_FrameReadNtk(pAbc);
          iVar1 = Abc_SclCheckNtk(pAVar2,0);
          if (iVar1 == 0) {
            fprintf((FILE *)pAbc->Err,"The current network is not in a topo order (run \"topo\").\n"
                   );
            pAbc_local._4_4_ = 1;
          }
          else if ((pAbc->pLibScl == (void *)0x0) ||
                  (iVar1 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar1 == 0)) {
            Abc_Print(-1,"Library delay info is not available.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            Abc_SclPrintBuffers((SC_Lib *)pAbc->pLibScl,pNtk_00,local_38);
            pAbc_local._4_4_ = 0;
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_38 = local_38 ^ 1;
  }
  fprintf((FILE *)pAbc->Err,"usage: print_buf [-vh]\n");
  fprintf((FILE *)pAbc->Err,"\t           prints buffers trees of the current design\n");
  pcVar3 = "no";
  if (local_38 != 0) {
    pcVar3 = "yes";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar3);
  fprintf((FILE *)pAbc->Err,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Scl_CommandPrintBuf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }

    Abc_SclPrintBuffers( (SC_Lib *)pAbc->pLibScl, pNtk, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: print_buf [-vh]\n" );
    fprintf( pAbc->Err, "\t           prints buffers trees of the current design\n" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}